

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManCountDupLut(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int pFanins [3];
  int local_3c;
  int local_38;
  int local_34;
  
  Gia_ManCleanMark01(p);
  uVar11 = 0;
  uVar8 = 0;
  uVar13 = 0;
  if (1 < p->nObjs) {
    uVar13 = 0;
    lVar12 = 1;
    lVar9 = 0xc;
    uVar8 = 0;
    uVar11 = 0;
    do {
      iVar4 = p->vMapping->nSize;
      if (iVar4 <= lVar12) goto LAB_0020c493;
      piVar2 = p->vMapping->pArray;
      uVar7 = piVar2[lVar12];
      if ((ulong)uVar7 != 0) {
        if (((int)uVar7 < 0) || (iVar4 <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar2 = piVar2 + uVar7;
        if (piVar2[(long)*piVar2 + 1] < 0) {
          pGVar10 = p->pObjs;
          uVar3 = *(ulong *)(&pGVar10->field_0x0 + lVar9);
          *(ulong *)(&pGVar10->field_0x0 + lVar9) = uVar3 | 0x4000000000000000;
          iVar4 = p->vMapping->nSize;
          if (iVar4 <= lVar12) {
LAB_0020c493:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar2 = p->vMapping->pArray;
          iVar1 = piVar2[lVar12];
          if (((long)iVar1 < 0) || (iVar4 <= iVar1)) goto LAB_0020c493;
          iVar4 = piVar2[iVar1];
          if (iVar4 == 2) {
            uVar7 = (uint)uVar3 & 0x1fffffff;
            uVar6 = *(ulong *)((long)pGVar10 + lVar9 + (ulong)(uVar7 * 4) * -3);
            if ((uVar6 & 0x4000000040000000) == 0) {
              pGVar10 = pGVar10 + (lVar12 - (ulong)uVar7);
              uVar8 = uVar8 + (((uint)uVar6 & 0x9fffffff) == 0x9fffffff);
            }
            else {
              uVar7 = (uint)(uVar3 >> 0x1e) & 0x7ffffffc;
              uVar6 = *(ulong *)((long)pGVar10 + lVar9 + (ulong)uVar7 * -3);
              pGVar10 = (Gia_Obj_t *)((long)pGVar10 + lVar9 + (ulong)uVar7 * -3);
              uVar8 = uVar8 + (((uint)uVar6 & 0x9fffffff) == 0x9fffffff);
              uVar11 = uVar11 + (((uint)uVar6 >> 0x1e & 1) != 0);
              uVar13 = uVar13 + ((uVar6 >> 0x3e & 1) != 0);
            }
          }
          else {
            if (iVar4 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x1bc,"int Gia_ManCountDupLut(Gia_Man_t *)");
            }
            Gia_ManPrintGetMuxFanins(p,(Gia_Obj_t *)(&pGVar10->field_0x0 + lVar9),&local_3c);
            lVar5 = (long)local_38;
            if ((lVar5 < 0) || (p->nObjs <= local_38)) {
LAB_0020c4d1:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar3 = *(ulong *)(p->pObjs + lVar5);
            *(ulong *)(p->pObjs + lVar5) = uVar3 | 0x40000000;
            if (((long)local_34 < 0) || (p->nObjs <= local_34)) goto LAB_0020c4d1;
            pGVar10 = p->pObjs + local_34;
            uVar6 = *(ulong *)pGVar10;
            uVar8 = uVar8 + (((uint)uVar3 & 0x9fffffff) == 0x9fffffff) +
                    (uint)(((uint)uVar6 & 0x9fffffff) == 0x9fffffff);
            uVar11 = uVar11 + (((uint)uVar3 >> 0x1e & 1) != 0) +
                     (uint)(((uint)uVar6 >> 0x1e & 1) != 0);
            uVar13 = uVar13 + ((uVar3 >> 0x3e & 1) != 0) + (uint)((uVar6 >> 0x3e & 1) != 0);
          }
          *(ulong *)pGVar10 = uVar6 | 0x40000000;
        }
      }
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  Gia_ManCleanMark01(p);
  uVar7 = uVar8 + uVar11;
  if (uVar7 + uVar13 != 0) {
    iVar4 = Gia_ManLutNum(p);
    printf("Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n",
           ((double)(int)(uVar7 + uVar13) * 100.0) / (double)iVar4,(ulong)uVar11,(ulong)uVar8,
           (ulong)uVar13,(ulong)uVar7);
  }
  return uVar7;
}

Assistant:

int Gia_ManCountDupLut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, pFanins[3], nCountDup = 0, nCountPis = 0, nCountMux = 0;
    Gia_ManCleanMark01( p );
    Gia_ManForEachLut( p, i )
        if ( Gia_ObjLutIsMux(p, i) )
        {
            pObj = Gia_ManObj( p, i );
            pObj->fMark1 = 1;
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, pObj, pFanins );

                pFanin = Gia_ManObj(p, pFanins[1]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;

                pFanin = Gia_ManObj(p, pFanins[2]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pFanin = Gia_ObjFanin0(pObj);
                if ( pFanin->fMark0 || pFanin->fMark1 )
                {
                    pFanin = Gia_ObjFanin1(pObj);
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
                else
                {
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
            }
            else assert( 0 );
        }
    Gia_ManCleanMark01( p );
    if ( nCountDup + nCountPis + nCountMux )
        printf( "Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n", 
            nCountDup, nCountPis, nCountMux, nCountDup + nCountPis, 100.0 * (nCountDup + nCountPis + nCountMux) / Gia_ManLutNum(p) );
    return nCountDup + nCountPis;
}